

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

bool pbrt::Quadratic(float a,float b,float c,float *t0,float *t1)

{
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  double dVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float q;
  float rootDiscrim;
  float discrim;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  undefined1 local_1;
  
  fVar1 = DifferenceOfProducts<float,float,float,float>
                    ((float)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0),in_stack_ffffffffffffffdc,
                     in_stack_ffffffffffffffd8);
  if (0.0 <= fVar1) {
    dVar2 = std::sqrt((double)(ulong)(uint)fVar1);
    if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
      dVar2 = std::copysign((double)((ulong)dVar2 & 0xffffffff),(double)(ulong)(uint)in_XMM1_Da);
      fVar1 = (in_XMM1_Da + SUB84(dVar2,0)) * -0.5;
      *in_RDI = fVar1 / in_XMM0_Da;
      *in_RSI = in_XMM2_Da / fVar1;
      if (*in_RSI < *in_RDI) {
        pstd::swap<float>(in_RDI,in_RSI);
      }
      local_1 = true;
    }
    else {
      *in_RSI = -in_XMM2_Da / in_XMM1_Da;
      *in_RDI = -in_XMM2_Da / in_XMM1_Da;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

PBRT_CPU_GPU
inline bool Quadratic(float a, float b, float c, float *t0, float *t1) {
    // Find quadratic discriminant
    float discrim = DifferenceOfProducts(b, b, 4 * a, c);
    if (discrim < 0)
        return false;
    float rootDiscrim = std::sqrt(discrim);

    if (a == 0) {
        *t0 = *t1 = -c / b;
        return true;
    }

    // Compute quadratic _t_ values
    float q = -0.5f * (b + std::copysign(rootDiscrim, b));
    *t0 = q / a;
    *t1 = c / q;
    if (*t0 > *t1)
        pstd::swap(*t0, *t1);
    return true;
}